

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest2.cpp
# Opt level: O0

void __thiscall UdpSocketTest::test1(UdpSocketTest *this)

{
  undefined1 local_3e0 [8];
  timespec t;
  int local_3c8;
  uint32_t new_number;
  uint32_t number;
  int res;
  Address client_addr;
  Address server_addr;
  ServerSocket server;
  Socket sock;
  Selector local_288 [8];
  Selector s;
  UdpSocketTest *this_local;
  
  Selector::Selector(local_288,(char *)0x0);
  JetHead::Socket::Socket((Socket *)&stack0xfffffffffffffd08,false);
  JetHead::ServerSocket::ServerSocket((ServerSocket *)(server_addr.mName + 8),false);
  JetHead::Socket::Address::Address((Address *)(client_addr.mName + 8));
  JetHead::Socket::Address::Address((Address *)&number);
  new_number = JetHead::ServerSocket::bind((Address *)(server_addr.mName + 8));
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xe7,"Bind Failed");
  }
  new_number = JetHead::Socket::getLocalAddress((Address *)(server_addr.mName + 8));
  JetHead::Socket::Address::setAddress(client_addr.mName + 8);
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xed,"get local addr failed");
  }
  JetHead::Socket::setSelector
            ((SocketListener *)(server_addr.mName + 8),(Selector *)&this->super_SocketListener);
  new_number = JetHead::Socket::connect((Address *)&stack0xfffffffffffffd08);
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xf5,"connect failed");
  }
  new_number = JetHead::Socket::getLocalAddress((Address *)&stack0xfffffffffffffd08);
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xfa,"get local addr failed");
  }
  new_number = JetHead::Socket::connect((Address *)(server_addr.mName + 8));
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xff,"server connet failed");
  }
  local_3c8 = 1000;
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x105,"connect failed");
  }
  new_number = JetHead::Socket::write(&stack0xfffffffffffffd08,(int)&local_3c8);
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x10a,"write failed");
  }
  new_number = JetHead::Socket::read(&stack0xfffffffffffffd08,(int)&t + 0xc);
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x10f,"read failed");
  }
  if (t.tv_nsec._4_4_ != local_3c8 + 1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x112,"Data Read failed");
  }
  local_3c8 = t.tv_nsec._4_4_ + 1;
  new_number = JetHead::Socket::write(&stack0xfffffffffffffd08,(int)&local_3c8);
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x119,"write failed");
  }
  new_number = JetHead::Socket::read(&stack0xfffffffffffffd08,(int)&t + 0xc);
  if (t.tv_nsec._4_4_ != local_3c8 + 1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x11e,"FAILED");
  }
  if ((int)new_number < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x121,"write failed");
  }
  this->mTestState = 0;
  JetHead::Socket::close();
  local_3e0 = (undefined1  [8])0x1;
  nanosleep((timespec *)local_3e0,(timespec *)0x0);
  JetHead::Socket::Address::~Address((Address *)&number);
  JetHead::Socket::Address::~Address((Address *)(client_addr.mName + 8));
  JetHead::ServerSocket::~ServerSocket((ServerSocket *)(server_addr.mName + 8));
  JetHead::Socket::~Socket((Socket *)&stack0xfffffffffffffd08);
  Selector::~Selector(local_288);
  return;
}

Assistant:

void UdpSocketTest::test1()
{	
  
    LOG_NOTICE( "UDP Test Started" );
    
    Selector s;
    
    Socket sock( false );
    ServerSocket server( false );
    Socket::Address server_addr, client_addr;
    
    int res = server.bind( server_addr );
    
    if ( res < 0 )
      TestFailed( "Bind Failed" );
    
    res = server.getLocalAddress( server_addr );
    server_addr.setAddress( "127.0.0.1" );
    
    if ( res < 0 )
      TestFailed( "get local addr failed" );
    
    LOG_NOTICE( "Server name %s:%d", server_addr.getName(), server_addr.getPort() );
    
    server.setSelector( this, &s );
    res = sock.connect( server_addr );
    
    if ( res < 0 )
      TestFailed( "connect failed" );
    
    res = sock.getLocalAddress( client_addr );
    
    if ( res < 0 )
      TestFailed( "get local addr failed" );
    
    res = server.connect( client_addr );
    
    if ( res < 0 )
      TestFailed( "server connet failed" );
    
    uint32_t number = 1000;
    uint32_t new_number;
    
    if ( res < 0 )
      TestFailed( "connect failed" );
    
    res = sock.write( &number, 4 );
    
    if ( res < 0 )
      TestFailed( "write failed" );
    
    res = sock.read( &new_number, 4 );
    
    if ( res < 0 )
      TestFailed( "read failed" );
    
    if ( new_number != number + 1 )
      TestFailed( "Data Read failed" );
    
    number = new_number + 1;
    
    res = sock.write( &number, 4 );
    
    if ( res < 0 )
      TestFailed( "write failed" );
    
    res = sock.read( &new_number, 4 );
    
    if ( new_number != number + 1 )
      TestFailed( "FAILED" );
    
    if ( res < 0 )
      TestFailed( "write failed" );
    
    LOG_NOTICE( "Data sent" );
    
    mTestState = 0;
    
    sock.close();
    
    struct timespec t;
    t.tv_sec = 1;
    nanosleep( &t, NULL );
    
    // TestPassed();
}